

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ThreadI2PAcceptIncoming(CConnman *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  CService *in_RDI;
  long in_FS_OFFSET;
  CAddress *unaff_retaddr;
  unique_ptr<Sock,_std::default_delete<Sock>_> *in_stack_00000008;
  CConnman *in_stack_00000010;
  bool advertising_listen_addr;
  anon_class_16_2_853cfe4a SleepOnFailure;
  seconds err_wait;
  Connection conn;
  CThreadInterrupt *in_stack_fffffffffffffe88;
  CService *pCVar4;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9d;
  ServiceFlags in_stack_fffffffffffffea8;
  CService *in_stack_fffffffffffffeb0;
  uint7 in_stack_fffffffffffffeb8;
  byte bVar5;
  CService *addr;
  Connection *conn_00;
  Session *in_stack_fffffffffffffee0;
  CService *in_stack_ffffffffffffff08;
  Connection *in_stack_ffffffffffffff30;
  Session *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff54;
  CService local_60 [2];
  CAddress *addr_00;
  
  addr_00 = *(CAddress **)(in_FS_OFFSET + 0x28);
  conn_00 = (Connection *)0x1;
  bVar5 = 0;
  i2p::Connection::Connection((Connection *)(ulong)in_stack_fffffffffffffeb8);
  addr = in_RDI;
  while (uVar1 = CThreadInterrupt::operator_cast_to_bool(in_stack_fffffffffffffe88),
        ((uVar1 ^ 0xff) & 1) != 0) {
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator->
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
               in_stack_fffffffffffffe88);
    uVar2 = i2p::sam::Session::Listen(in_stack_fffffffffffffee0,conn_00);
    if ((bool)uVar2) {
      if ((bVar5 & 1) == 0) {
        AddLocal(in_stack_ffffffffffffff08,in_stack_ffffffffffffff54);
        bVar5 = 1;
      }
      std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::operator->
                ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                 in_stack_fffffffffffffe88);
      uVar3 = i2p::sam::Session::Accept(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if ((bool)uVar3) {
        pCVar4 = local_60;
        CService::CService((CService *)
                           CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe9d,
                                                                  CONCAT14(uVar3,
                                                  in_stack_fffffffffffffe98)))),pCVar4);
        CAddress::CAddress((CAddress *)CONCAT17(bVar5,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        CService::CService((CService *)
                           CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe9d,
                                                                  CONCAT14(uVar3,
                                                  in_stack_fffffffffffffe98)))),pCVar4);
        CAddress::CAddress((CAddress *)CONCAT17(bVar5,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        CreateNodeFromAcceptedSocket
                  (in_stack_00000010,in_stack_00000008,conn.me._36_4_,unaff_retaddr,addr_00);
        CAddress::~CAddress((CAddress *)in_stack_fffffffffffffe88);
        CService::~CService((CService *)in_stack_fffffffffffffe88);
        CAddress::~CAddress((CAddress *)in_stack_fffffffffffffe88);
        CService::~CService((CService *)in_stack_fffffffffffffe88);
        conn_00 = (Connection *)1;
      }
      else {
        ThreadI2PAcceptIncoming::anon_class_16_2_853cfe4a::operator()
                  ((anon_class_16_2_853cfe4a *)in_RDI);
      }
    }
    else {
      if (((bVar5 & 1) != 0) &&
         (in_stack_fffffffffffffe9d = CNetAddr::IsValid(&in_RDI->super_CNetAddr),
         (bool)in_stack_fffffffffffffe9d)) {
        RemoveLocal(addr);
        bVar5 = 0;
      }
      ThreadI2PAcceptIncoming::anon_class_16_2_853cfe4a::operator()
                ((anon_class_16_2_853cfe4a *)in_RDI);
    }
  }
  i2p::Connection::~Connection((Connection *)in_stack_fffffffffffffe88);
  if (*(CAddress **)(in_FS_OFFSET + 0x28) != addr_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadI2PAcceptIncoming()
{
    static constexpr auto err_wait_begin = 1s;
    static constexpr auto err_wait_cap = 5min;
    auto err_wait = err_wait_begin;

    bool advertising_listen_addr = false;
    i2p::Connection conn;

    auto SleepOnFailure = [&]() {
        interruptNet.sleep_for(err_wait);
        if (err_wait < err_wait_cap) {
            err_wait += 1s;
        }
    };

    while (!interruptNet) {

        if (!m_i2p_sam_session->Listen(conn)) {
            if (advertising_listen_addr && conn.me.IsValid()) {
                RemoveLocal(conn.me);
                advertising_listen_addr = false;
            }
            SleepOnFailure();
            continue;
        }

        if (!advertising_listen_addr) {
            AddLocal(conn.me, LOCAL_MANUAL);
            advertising_listen_addr = true;
        }

        if (!m_i2p_sam_session->Accept(conn)) {
            SleepOnFailure();
            continue;
        }

        CreateNodeFromAcceptedSocket(std::move(conn.sock), NetPermissionFlags::None,
                                     CAddress{conn.me, NODE_NONE}, CAddress{conn.peer, NODE_NONE});

        err_wait = err_wait_begin;
    }
}